

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indextest.cpp
# Opt level: O1

int testIndexLotsaEntries(void)

{
  int iVar1;
  VRDataIndex *this;
  VRAnyCoreType VVar2;
  int iVar3;
  int iVar4;
  stringstream name;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar3 = 0;
  this = setupIndex();
  do {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"/henry/entry",0xc);
    std::ostream::operator<<(local_1a8,iVar3);
    std::__cxx11::stringbuf::str();
    MinVR::VRDataIndex::addData(&local_1d8,this,&local_218,iVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 1000);
  iVar3 = 0;
  iVar4 = 0;
  do {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"/henry/entry",0xc);
    std::ostream::operator<<(local_1a8,iVar4);
    std::__cxx11::stringbuf::str();
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
    VVar2 = MinVR::VRDataIndex::getValue(this,&local_218,&local_1f8,true);
    iVar1 = (*(VVar2.datum)->_vptr_VRDatum[6])(VVar2.datum);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    iVar3 = iVar3 + (uint)(iVar4 != iVar1);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 1000);
  MinVR::VRDataIndex::~VRDataIndex(this);
  operator_delete(this,0x98);
  return iVar3;
}

Assistant:

int testIndexLotsaEntries() {

  int out = 0;

  LOOP {

    MinVR::VRDataIndex *n = setupIndex();

    int lctr;
    int N = 1000;

    for (lctr = 0; lctr < N; lctr++) {
      std::stringstream name;
      name << "/henry/entry" << lctr;

      n->addData(name.str(), lctr);
    }

    for (lctr = 0; lctr < N; lctr++) {
      std::stringstream name;
      name << "/henry/entry" << lctr;

      out += ((lctr == (int)n->getValue(name.str())) ? 0 : 1);
    }

    delete n;
  }